

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib586.c
# Opt level: O1

void my_unlock(CURL *handle,curl_lock_data data,void *useptr)

{
  if (data - CURL_LOCK_DATA_SHARE < 4) {
    curl_mprintf("unlock: %-6s [%s]: %d\n",
                 (&PTR_anon_var_dwarf_1b5_00103d80)[data - CURL_LOCK_DATA_SHARE],*useptr,
                 *(undefined4 *)((long)useptr + 8));
    *(int *)((long)useptr + 8) = *(int *)((long)useptr + 8) + 1;
    return;
  }
  curl_mfprintf(_stderr,"unlock: no such data: %d\n");
  return;
}

Assistant:

static void my_unlock(CURL *handle, curl_lock_data data, void *useptr)
{
  const char *what;
  struct userdata *user = (struct userdata *)useptr;
  (void)handle;
  switch(data) {
    case CURL_LOCK_DATA_SHARE:
      what = "share";
      break;
    case CURL_LOCK_DATA_DNS:
      what = "dns";
      break;
    case CURL_LOCK_DATA_COOKIE:
      what = "cookie";
      break;
    case CURL_LOCK_DATA_SSL_SESSION:
      what = "ssl_session";
      break;
    default:
      fprintf(stderr, "unlock: no such data: %d\n", (int)data);
      return;
  }
  printf("unlock: %-6s [%s]: %d\n", what, user->text, user->counter);
  user->counter++;
}